

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O2

void vardata_del(vardata *data)

{
  long lVar1;
  long lVar2;
  
  free(data->name);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < data->featuresnum; lVar2 = lVar2 + 1) {
    free(*(void **)((long)&data->features->name + lVar1));
    free(*(void **)((long)&data->features->description + lVar1));
    free(*(void **)((long)&data->features->ifmask + lVar1));
    free(*(void **)((long)&data->features->cfmask + lVar1));
    free(*(void **)((long)&data->features->implies + lVar1));
    free(*(void **)((long)&data->features->conflicts + lVar1));
    lVar1 = lVar1 + 0x40;
  }
  free(data->features);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < data->variantsnum; lVar2 = lVar2 + 1) {
    free(*(void **)((long)&data->variants->name + lVar1));
    free(*(void **)((long)&data->variants->description + lVar1));
    free(*(void **)((long)&data->variants->fmask + lVar1));
    free(*(void **)((long)&data->variants->features + lVar1));
    lVar1 = lVar1 + 0x30;
  }
  free(data->variants);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < data->varsetsnum; lVar2 = lVar2 + 1) {
    free(*(void **)((long)&data->varsets->name + lVar1));
    free(*(void **)((long)&data->varsets->description + lVar1));
    lVar1 = lVar1 + 0x10;
  }
  free(data->varsets);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < data->modesnum; lVar2 = lVar2 + 1) {
    free(*(void **)((long)&data->modes->name + lVar1));
    free(*(void **)((long)&data->modes->description + lVar1));
    free(*(void **)((long)&data->modes->rfmask + lVar1));
    free(*(void **)((long)&data->modes->rfeatures + lVar1));
    lVar1 = lVar1 + 0x30;
  }
  free(data->modes);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < data->modesetsnum; lVar2 = lVar2 + 1) {
    free(*(void **)((long)&data->modesets->name + lVar1));
    free(*(void **)((long)&data->modesets->description + lVar1));
    lVar1 = lVar1 + 0x18;
  }
  free(data->modesets);
  symtab_del(data->symtab);
  free(data);
  return;
}

Assistant:

void vardata_del(struct vardata *data) {
	int i;
	free(data->name);
	for (i = 0; i < data->featuresnum; i++) {
		free(data->features[i].name);
		free(data->features[i].description);
		free(data->features[i].ifmask);
		free(data->features[i].cfmask);
		free(data->features[i].implies);
		free(data->features[i].conflicts);
	}
	free(data->features);
	for (i = 0; i < data->variantsnum; i++) {
		free(data->variants[i].name);
		free(data->variants[i].description);
		free(data->variants[i].fmask);
		free(data->variants[i].features);
	}
	free(data->variants);
	for (i = 0; i < data->varsetsnum; i++) {
		free(data->varsets[i].name);
		free(data->varsets[i].description);
	}
	free(data->varsets);
	for (i = 0; i < data->modesnum; i++) {
		free(data->modes[i].name);
		free(data->modes[i].description);
		free(data->modes[i].rfmask);
		free(data->modes[i].rfeatures);
	}
	free(data->modes);
	for (i = 0; i < data->modesetsnum; i++) {
		free(data->modesets[i].name);
		free(data->modesets[i].description);
	}
	free(data->modesets);
	symtab_del(data->symtab);
	free(data);
}